

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O1

int block_cipher_df(uchar *output,uchar *data,size_t data_len)

{
  undefined8 uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uchar *puVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 *puVar9;
  bool bVar10;
  undefined1 local_368 [3];
  char cStack_365;
  uchar buf [416];
  mbedtls_aes_context aes_ctx;
  uchar tmp [48];
  uchar key [32];
  ulong uStack_48;
  uchar chain [16];
  
  iVar2 = -0x38;
  if (data_len < 0x181) {
    lVar6 = 0;
    chain._8_8_ = output;
    memset(local_368,0,0x1a0);
    mbedtls_aes_init((mbedtls_aes_context *)(buf + 0x198));
    uVar8 = (uint)data_len;
    buf._8_4_ = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    buf[0xf] = '0';
    memcpy(buf + 0x10,data,data_len);
    buf[data_len + 0x10] = 0x80;
    do {
      tmp[lVar6 + 0x28] = (uchar)lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x20);
    iVar2 = mbedtls_aes_setkey_enc((mbedtls_aes_context *)(buf + 0x198),tmp + 0x28,0x100);
    if (iVar2 == 0) {
      uVar3 = 0;
      do {
        uStack_48 = 0;
        chain[0] = '\0';
        chain[1] = '\0';
        chain[2] = '\0';
        chain[3] = '\0';
        chain[4] = '\0';
        chain[5] = '\0';
        chain[6] = '\0';
        chain[7] = '\0';
        puVar9 = local_368;
        uVar7 = data_len + 0x19;
        while (uVar1 = chain._0_8_, uVar7 != 0) {
          uVar4 = 0;
          do {
            *(ulong *)(chain + (uVar4 - 8)) =
                 *(ulong *)(chain + (uVar4 - 8)) ^ *(ulong *)(puVar9 + uVar4);
            uVar4 = uVar4 + 8;
          } while (uVar4 < 9);
          puVar9 = puVar9 + 0x10;
          bVar10 = uVar7 < 0x10;
          uVar7 = uVar7 - 0x10;
          if (bVar10) {
            uVar7 = 0;
          }
          iVar2 = mbedtls_aes_crypt_ecb
                            ((mbedtls_aes_context *)(buf + 0x198),1,(uchar *)&uStack_48,
                             (uchar *)&uStack_48);
          if (iVar2 != 0) goto LAB_001bb6b2;
        }
        cStack_365 = cStack_365 + '\x01';
        *(ulong *)(tmp + (uVar3 - 8)) = uStack_48;
        *(undefined8 *)(tmp + uVar3) = uVar1;
        bVar10 = uVar3 < 0x20;
        uVar3 = uVar3 + 0x10;
      } while (bVar10);
      iVar2 = mbedtls_aes_setkey_enc
                        ((mbedtls_aes_context *)(buf + 0x198),(uchar *)(aes_ctx.buf + 0x42),0x100);
      if (iVar2 == 0) {
        uVar8 = 0xfffffff0;
        puVar5 = (uchar *)chain._8_8_;
        do {
          iVar2 = mbedtls_aes_crypt_ecb
                            ((mbedtls_aes_context *)(buf + 0x198),1,tmp + 0x18,tmp + 0x18);
          if (iVar2 != 0) break;
          *(undefined8 *)puVar5 = tmp._24_8_;
          *(undefined8 *)(puVar5 + 8) = tmp._32_8_;
          puVar5 = puVar5 + 0x10;
          uVar8 = uVar8 + 0x10;
          iVar2 = 0;
        } while (uVar8 < 0x20);
      }
    }
LAB_001bb6b2:
    mbedtls_aes_free((mbedtls_aes_context *)(buf + 0x198));
    mbedtls_platform_zeroize(local_368,0x1a0);
    mbedtls_platform_zeroize(aes_ctx.buf + 0x42,0x30);
    mbedtls_platform_zeroize(tmp + 0x28,0x20);
    mbedtls_platform_zeroize(&uStack_48,0x10);
    if (iVar2 != 0) {
      mbedtls_platform_zeroize((void *)chain._8_8_,0x30);
    }
  }
  return iVar2;
}

Assistant:

static int block_cipher_df(unsigned char *output,
                           const unsigned char *data, size_t data_len)
{
    unsigned char buf[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT +
                      MBEDTLS_CTR_DRBG_BLOCKSIZE + 16];
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char key[MBEDTLS_CTR_DRBG_KEYSIZE];
    unsigned char chain[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    unsigned char *p, *iv;
    mbedtls_aes_context aes_ctx;
    int ret = 0;

    int i, j;
    size_t buf_len, use_len;

    if (data_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT) {
        return MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG;
    }

    memset(buf, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT +
           MBEDTLS_CTR_DRBG_BLOCKSIZE + 16);
    mbedtls_aes_init(&aes_ctx);

    /*
     * Construct IV (16 bytes) and S in buffer
     * IV = Counter (in 32-bits) padded to 16 with zeroes
     * S = Length input string (in 32-bits) || Length of output (in 32-bits) ||
     *     data || 0x80
     *     (Total is padded to a multiple of 16-bytes with zeroes)
     */
    p = buf + MBEDTLS_CTR_DRBG_BLOCKSIZE;
    MBEDTLS_PUT_UINT32_BE(data_len, p, 0);
    p += 4 + 3;
    *p++ = MBEDTLS_CTR_DRBG_SEEDLEN;
    memcpy(p, data, data_len);
    p[data_len] = 0x80;

    buf_len = MBEDTLS_CTR_DRBG_BLOCKSIZE + 8 + data_len + 1;

    for (i = 0; i < MBEDTLS_CTR_DRBG_KEYSIZE; i++) {
        key[i] = i;
    }

    if ((ret = mbedtls_aes_setkey_enc(&aes_ctx, key,
                                      MBEDTLS_CTR_DRBG_KEYBITS)) != 0) {
        goto exit;
    }

    /*
     * Reduce data to MBEDTLS_CTR_DRBG_SEEDLEN bytes of data
     */
    for (j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE) {
        p = buf;
        memset(chain, 0, MBEDTLS_CTR_DRBG_BLOCKSIZE);
        use_len = buf_len;

        while (use_len > 0) {
            mbedtls_xor(chain, chain, p, MBEDTLS_CTR_DRBG_BLOCKSIZE);
            p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
            use_len -= (use_len >= MBEDTLS_CTR_DRBG_BLOCKSIZE) ?
                       MBEDTLS_CTR_DRBG_BLOCKSIZE : use_len;

            if ((ret = mbedtls_aes_crypt_ecb(&aes_ctx, MBEDTLS_AES_ENCRYPT,
                                             chain, chain)) != 0) {
                goto exit;
            }
        }

        memcpy(tmp + j, chain, MBEDTLS_CTR_DRBG_BLOCKSIZE);

        /*
         * Update IV
         */
        buf[3]++;
    }

    /*
     * Do final encryption with reduced data
     */
    if ((ret = mbedtls_aes_setkey_enc(&aes_ctx, tmp,
                                      MBEDTLS_CTR_DRBG_KEYBITS)) != 0) {
        goto exit;
    }
    iv = tmp + MBEDTLS_CTR_DRBG_KEYSIZE;
    p = output;

    for (j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE) {
        if ((ret = mbedtls_aes_crypt_ecb(&aes_ctx, MBEDTLS_AES_ENCRYPT,
                                         iv, iv)) != 0) {
            goto exit;
        }
        memcpy(p, iv, MBEDTLS_CTR_DRBG_BLOCKSIZE);
        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }
exit:
    mbedtls_aes_free(&aes_ctx);
    /*
     * tidy up the stack
     */
    mbedtls_platform_zeroize(buf, sizeof(buf));
    mbedtls_platform_zeroize(tmp, sizeof(tmp));
    mbedtls_platform_zeroize(key, sizeof(key));
    mbedtls_platform_zeroize(chain, sizeof(chain));
    if (0 != ret) {
        /*
         * wipe partial seed from memory
         */
        mbedtls_platform_zeroize(output, MBEDTLS_CTR_DRBG_SEEDLEN);
    }

    return ret;
}